

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O1

string * __thiscall
t_xsd_generator::xsd(string *__return_storage_ptr__,t_xsd_generator *this,string *in)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  pcVar1 = (in->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + in->_M_string_length);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"xsd","");
  ns(__return_storage_ptr__,this,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string xsd(std::string in) { return ns(in, "xsd"); }